

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

int oonf_layer2_neigh_key_from_string(oonf_layer2_neigh_key *key,char *string)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ssize_t len;
  char *addr;
  char *split;
  netaddr_str nbuf;
  char *string_local;
  oonf_layer2_neigh_key *key_local;
  
  nbuf.buf._54_8_ = string;
  memset(key,0,0x23);
  pcVar2 = strchr((char *)nbuf.buf._54_8_,0x2c);
  if (pcVar2 != (char *)0x0) {
    if (0x3e < (long)pcVar2 - nbuf.buf._54_8_) {
      return -1;
    }
    strscpy((long)&split + 2,nbuf.buf._54_8_,((long)pcVar2 - nbuf.buf._54_8_) + 1);
    lVar3 = strhex_to_bin(key->link_id,0x10,pcVar2 + 1);
    if (lVar3 < 0) {
      return -2;
    }
    key->link_id_length = (uint8_t)lVar3;
  }
  iVar1 = netaddr_from_string(key);
  if (iVar1 == 0) {
    if (((key->addr)._type == '/') || ((key->addr)._type == '0')) {
      key_local._4_4_ = 0;
    }
    else {
      memset(key,0,0x12);
      key_local._4_4_ = -4;
    }
  }
  else {
    memset(key,0,0x12);
    key_local._4_4_ = -3;
  }
  return key_local._4_4_;
}

Assistant:

int
oonf_layer2_neigh_key_from_string(struct oonf_layer2_neigh_key *key, const char *string) {
  struct netaddr_str nbuf;
  const char *split, *addr;
  ssize_t len;

  memset(key, 0, sizeof(*key));
  split = strchr(string, ',');

  if (!split) {
    addr = string;
  }
  else {
    len = split - string;
    if (len > (ssize_t)(sizeof(nbuf))) {
      return -1;
    }

    strscpy(nbuf.buf, string, len+1);
    addr = nbuf.buf;

    split++;
    len = strhex_to_bin(key->link_id, sizeof(key->link_id), split);
    if (len < 0) {
      return -2;
    }
    key->link_id_length = len;
  }

  if (netaddr_from_string(&key->addr, addr)) {
    netaddr_invalidate(&key->addr);
    return -3;
  }
  if (netaddr_get_address_family(&key->addr) != AF_MAC48
      && netaddr_get_address_family(&key->addr) != AF_EUI64) {
    netaddr_invalidate(&key->addr);
    return -4;
  }
  return 0;
}